

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::Delete(FreeList<wabt::interp::Ref> *this,Index index)

{
  ulong *puVar1;
  iterator __position;
  Index IVar2;
  Index local_8;
  
  (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start[index].index = 0;
  IVar2 = index + 0x3f;
  if (-1 < (long)index) {
    IVar2 = index;
  }
  puVar1 = (this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)IVar2 >> 6) +
           (ulong)((index & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)index & 0x3f);
  __position._M_current =
       (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = index;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->free_,__position,
               &local_8);
  }
  else {
    *__position._M_current = index;
    (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}